

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderHelperInvocationTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::HelperInvocationValueCase::init
          (HelperInvocationValueCase *this,EVP_PKEY_CTX *ctx)

{
  PtrData<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> data;
  PtrData<deqp::gles31::Functional::(anonymous_namespace)::FboHelper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::FboHelper>_>
  data_00;
  bool bVar1;
  int iVar2;
  int extraout_EAX;
  undefined4 extraout_var;
  ShaderProgram *pSVar3;
  RenderContext *renderCtx_00;
  ProgramSources *pPVar4;
  TestLog *pTVar5;
  TestError *this_00;
  MessageBuilder *pMVar6;
  FboHelper *this_01;
  ShaderProgram *in_stack_fffffffffffffbf8;
  undefined8 in_stack_fffffffffffffc00;
  PtrData<deqp::gles31::Functional::(anonymous_namespace)::FboHelper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::FboHelper>_>
  *__return_storage_ptr__;
  int local_37c;
  DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::FboHelper> local_369;
  PtrData<deqp::gles31::Functional::(anonymous_namespace)::FboHelper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::FboHelper>_>
  local_368;
  PtrData<deqp::gles31::Functional::(anonymous_namespace)::FboHelper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::FboHelper>_>
  *local_358;
  MessageBuilder local_348;
  DefaultDeleter<glu::ShaderProgram> local_1c3;
  undefined1 local_1c2;
  allocator<char> local_1c1;
  string local_1c0;
  ShaderSource local_1a0;
  allocator<char> local_171;
  string local_170;
  ShaderSource local_150;
  ProgramSources local_128;
  PtrData<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> local_48;
  PtrData<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *local_38;
  int local_28;
  int local_24;
  int actualSamples;
  int maxSamples;
  Functions *gl;
  RenderContext *renderCtx;
  HelperInvocationValueCase *this_local;
  
  renderCtx = (RenderContext *)this;
  gl = (Functions *)gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (**(_func_int **)((long)gl->activeShaderProgram + 0x18))();
  _actualSamples = (Functions *)CONCAT44(extraout_var,iVar2);
  local_24 = getInteger(_actualSamples,0x8d57);
  local_37c = local_24;
  if (this->m_numSamples != -1) {
    local_37c = this->m_numSamples;
  }
  local_28 = local_37c;
  pSVar3 = (ShaderProgram *)operator_new(0xd0);
  local_1c2 = 1;
  renderCtx_00 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_128);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,
             "#version 310 es\nin highp vec2 a_position;\nuniform highp float u_pointSize;\nvoid main (void)\n{\n\tgl_Position = vec4(a_position, 0.0, 1.0);\n\tgl_PointSize = u_pointSize;\n}\n"
             ,&local_171);
  glu::VertexSource::VertexSource((VertexSource *)&local_150,&local_170);
  pPVar4 = glu::ProgramSources::operator<<(&local_128,&local_150);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,
             "#version 310 es\nout mediump vec4 o_color;\nvoid main (void)\n{\n\tif (gl_HelperInvocation)\n\t\to_color = vec4(1.0, 0.0, 0.0, 1.0);\n\telse\n\t\to_color = vec4(0.0, 1.0, 0.0, 1.0);\n}\n"
             ,&local_1c1);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_1a0,&local_1c0);
  pPVar4 = glu::ProgramSources::operator<<(pPVar4,&local_1a0);
  glu::ShaderProgram::ShaderProgram(pSVar3,renderCtx_00,pPVar4);
  local_1c2 = 0;
  de::DefaultDeleter<glu::ShaderProgram>::DefaultDeleter(&local_1c3);
  de::details::MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::MovePtr
            ((MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *)&local_48);
  local_38 = de::details::MovePtr::operator_cast_to_PtrData(&local_48,(MovePtr *)pSVar3);
  data._8_8_ = in_stack_fffffffffffffc00;
  data.ptr = in_stack_fffffffffffffbf8;
  de::details::MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::operator=
            (&this->m_program,data);
  de::details::MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::~MovePtr
            ((MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *)&local_48);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  glu::VertexSource::~VertexSource((VertexSource *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator(&local_171);
  glu::ProgramSources::~ProgramSources(&local_128);
  pTVar5 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pSVar3 = de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
           operator*(&(this->m_program).
                      super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>)
  ;
  glu::operator<<(pTVar5,pSVar3);
  pSVar3 = de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
           operator->(&(this->m_program).
                       super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                     );
  bVar1 = glu::ShaderProgram::isOk(pSVar3);
  if (bVar1) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_348,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_348,(char (*) [33])"Using GL_RGBA8 framebuffer with ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_28);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [9])0x2c20441);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_348);
    this_01 = (FboHelper *)operator_new(0x78);
    FboHelper::FboHelper(this_01,(RenderContext *)gl,0x100,0x100,0x8058,local_28);
    de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::FboHelper>::DefaultDeleter
              (&local_369);
    __return_storage_ptr__ = &local_368;
    de::details::
    MovePtr<deqp::gles31::Functional::(anonymous_namespace)::FboHelper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::FboHelper>_>
    ::MovePtr();
    local_358 = de::details::MovePtr::operator_cast_to_PtrData
                          (__return_storage_ptr__,(MovePtr *)this_01);
    data_00._8_8_ = __return_storage_ptr__;
    data_00.ptr = (FboHelper *)in_stack_fffffffffffffbf8;
    de::details::
    MovePtr<deqp::gles31::Functional::(anonymous_namespace)::FboHelper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::FboHelper>_>
    ::operator=(&this->m_fbo,data_00);
    de::details::
    MovePtr<deqp::gles31::Functional::(anonymous_namespace)::FboHelper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::FboHelper>_>
    ::~MovePtr((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::FboHelper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::FboHelper>_>
                *)&local_368);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
    return extraout_EAX;
  }
  de::details::MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::clear
            (&this->m_program);
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Compile failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderHelperInvocationTests.cpp"
             ,0x16b);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void HelperInvocationValueCase::init (void)
{
	const glu::RenderContext&	renderCtx		= m_context.getRenderContext();
	const glw::Functions&		gl				= renderCtx.getFunctions();
	const int					maxSamples		= getInteger(gl, GL_MAX_SAMPLES);
	const int					actualSamples	= m_numSamples == NUM_SAMPLES_MAX ? maxSamples : m_numSamples;

	m_program = MovePtr<ShaderProgram>(new ShaderProgram(m_context.getRenderContext(),
		glu::ProgramSources()
			<< glu::VertexSource(
				"#version 310 es\n"
				"in highp vec2 a_position;\n"
				"uniform highp float u_pointSize;\n"
				"void main (void)\n"
				"{\n"
				"	gl_Position = vec4(a_position, 0.0, 1.0);\n"
				"	gl_PointSize = u_pointSize;\n"
				"}\n")
			<< glu::FragmentSource(
				"#version 310 es\n"
				"out mediump vec4 o_color;\n"
				"void main (void)\n"
				"{\n"
				"	if (gl_HelperInvocation)\n"
				"		o_color = vec4(1.0, 0.0, 0.0, 1.0);\n"
				"	else\n"
				"		o_color = vec4(0.0, 1.0, 0.0, 1.0);\n"
				"}\n")));

	m_testCtx.getLog() << *m_program;

	if (!m_program->isOk())
	{
		m_program.clear();
		TCU_FAIL("Compile failed");
	}

	m_testCtx.getLog() << TestLog::Message << "Using GL_RGBA8 framebuffer with "
					   << actualSamples << " samples" << TestLog::EndMessage;

	m_fbo = MovePtr<FboHelper>(new FboHelper(renderCtx, FRAMEBUFFER_WIDTH, FRAMEBUFFER_HEIGHT,
											 FRAMEBUFFER_FORMAT, actualSamples));

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
}